

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_disk_posix.c
# Opt level: O2

wchar_t set_times(archive_write_disk *a,wchar_t fd,wchar_t mode,char *name,time_t atime,
                 long atime_nanos,time_t birthtime,long birthtime_nanos,time_t mtime,
                 long mtime_nanos,time_t cctime,long ctime_nanos)

{
  int iVar1;
  wchar_t wVar2;
  int *piVar3;
  undefined4 in_register_00000014;
  timespec ts [2];
  
  ts[1].tv_nsec = birthtime;
  ts[0].tv_sec = (__time_t)name;
  ts[0].tv_nsec = atime;
  ts[1].tv_sec = atime_nanos;
  if (fd < L'\0') {
    iVar1 = utimensat(-100,(char *)CONCAT44(in_register_00000014,mode),(timespec *)ts,0x100);
  }
  else {
    iVar1 = futimens(fd,(timespec *)ts);
  }
  if (iVar1 == 0) {
    wVar2 = L'\0';
  }
  else {
    piVar3 = __errno_location();
    archive_set_error(&a->archive,*piVar3,"Can\'t restore time");
    wVar2 = L'\xffffffec';
  }
  return wVar2;
}

Assistant:

static int
set_times(struct archive_write_disk *a,
    int fd, int mode, const char *name,
    time_t atime, long atime_nanos,
    time_t birthtime, long birthtime_nanos,
    time_t mtime, long mtime_nanos,
    time_t cctime, long ctime_nanos)
{
	/* Note: set_time doesn't use libarchive return conventions!
	 * It uses syscall conventions.  So 0 here instead of ARCHIVE_OK. */
	int r1 = 0, r2 = 0;

#ifdef F_SETTIMES
	 /*
	 * on Tru64 try own fcntl first which can restore even the
	 * ctime, fall back to default code path below if it fails
	 * or if we are not running as root
	 */
	if (a->user_uid == 0 &&
	    set_time_tru64(fd, mode, name,
			   atime, atime_nanos, mtime,
			   mtime_nanos, cctime, ctime_nanos) == 0) {
		return (ARCHIVE_OK);
	}
#else /* Tru64 */
	(void)cctime; /* UNUSED */
	(void)ctime_nanos; /* UNUSED */
#endif /* Tru64 */

#ifdef HAVE_STRUCT_STAT_ST_BIRTHTIME
	/*
	 * If you have struct stat.st_birthtime, we assume BSD
	 * birthtime semantics, in which {f,l,}utimes() updates
	 * birthtime to earliest mtime.  So we set the time twice,
	 * first using the birthtime, then using the mtime.  If
	 * birthtime == mtime, this isn't necessary, so we skip it.
	 * If birthtime > mtime, then this won't work, so we skip it.
	 */
	if (birthtime < mtime
	    || (birthtime == mtime && birthtime_nanos < mtime_nanos))
		r1 = set_time(fd, mode, name,
			      atime, atime_nanos,
			      birthtime, birthtime_nanos);
#else
	(void)birthtime; /* UNUSED */
	(void)birthtime_nanos; /* UNUSED */
#endif
	r2 = set_time(fd, mode, name,
		      atime, atime_nanos,
		      mtime, mtime_nanos);
	if (r1 != 0 || r2 != 0) {
		archive_set_error(&a->archive, errno,
				  "Can't restore time");
		return (ARCHIVE_WARN);
	}
	return (ARCHIVE_OK);
}